

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bound_case_expression.cpp
# Opt level: O2

bool __thiscall
duckdb::BoundCaseExpression::Equals(BoundCaseExpression *this,BaseExpression *other_p)

{
  _func_int *UNRECOVERED_JUMPTABLE;
  bool bVar1;
  int iVar2;
  BoundCaseExpression *pBVar3;
  const_reference pvVar4;
  type pEVar5;
  type pEVar6;
  undefined8 extraout_RDX;
  idx_t i;
  ulong __n;
  
  bVar1 = Expression::Equals(&this->super_Expression,other_p);
  if ((bVar1) &&
     (pBVar3 = BaseExpression::Cast<duckdb::BoundCaseExpression>(other_p),
     (long)(this->case_checks).
           super_vector<duckdb::BoundCaseCheck,_std::allocator<duckdb::BoundCaseCheck>_>.
           super__Vector_base<duckdb::BoundCaseCheck,_std::allocator<duckdb::BoundCaseCheck>_>.
           _M_impl.super__Vector_impl_data._M_finish -
     (long)(this->case_checks).
           super_vector<duckdb::BoundCaseCheck,_std::allocator<duckdb::BoundCaseCheck>_>.
           super__Vector_base<duckdb::BoundCaseCheck,_std::allocator<duckdb::BoundCaseCheck>_>.
           _M_impl.super__Vector_impl_data._M_start ==
     (long)(pBVar3->case_checks).
           super_vector<duckdb::BoundCaseCheck,_std::allocator<duckdb::BoundCaseCheck>_>.
           super__Vector_base<duckdb::BoundCaseCheck,_std::allocator<duckdb::BoundCaseCheck>_>.
           _M_impl.super__Vector_impl_data._M_finish -
     (long)(pBVar3->case_checks).
           super_vector<duckdb::BoundCaseCheck,_std::allocator<duckdb::BoundCaseCheck>_>.
           super__Vector_base<duckdb::BoundCaseCheck,_std::allocator<duckdb::BoundCaseCheck>_>.
           _M_impl.super__Vector_impl_data._M_start)) {
    __n = 0;
    do {
      if ((ulong)((long)(this->case_checks).
                        super_vector<duckdb::BoundCaseCheck,_std::allocator<duckdb::BoundCaseCheck>_>
                        .
                        super__Vector_base<duckdb::BoundCaseCheck,_std::allocator<duckdb::BoundCaseCheck>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                  (long)(this->case_checks).
                        super_vector<duckdb::BoundCaseCheck,_std::allocator<duckdb::BoundCaseCheck>_>
                        .
                        super__Vector_base<duckdb::BoundCaseCheck,_std::allocator<duckdb::BoundCaseCheck>_>
                        ._M_impl.super__Vector_impl_data._M_start >> 4) <= __n) {
        pEVar5 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
                 operator*(&this->else_expr);
        pEVar6 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
                 operator*(&pBVar3->else_expr);
        UNRECOVERED_JUMPTABLE = (pEVar5->super_BaseExpression)._vptr_BaseExpression[10];
        iVar2 = (*UNRECOVERED_JUMPTABLE)(pEVar5,pEVar6,extraout_RDX,UNRECOVERED_JUMPTABLE);
        return SUB41(iVar2,0);
      }
      pvVar4 = vector<duckdb::BoundCaseCheck,_true>::get<true>(&this->case_checks,__n);
      pEVar5 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
               operator*(&pvVar4->when_expr);
      pvVar4 = vector<duckdb::BoundCaseCheck,_true>::get<true>(&pBVar3->case_checks,__n);
      pEVar6 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
               operator*(&pvVar4->when_expr);
      iVar2 = (*(pEVar5->super_BaseExpression)._vptr_BaseExpression[10])(pEVar5,pEVar6);
      if ((char)iVar2 == '\0') {
        return false;
      }
      pvVar4 = vector<duckdb::BoundCaseCheck,_true>::get<true>(&this->case_checks,__n);
      pEVar5 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
               operator*(&pvVar4->then_expr);
      pvVar4 = vector<duckdb::BoundCaseCheck,_true>::get<true>(&pBVar3->case_checks,__n);
      pEVar6 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
               operator*(&pvVar4->then_expr);
      iVar2 = (*(pEVar5->super_BaseExpression)._vptr_BaseExpression[10])(pEVar5,pEVar6);
      __n = __n + 1;
    } while ((char)iVar2 != '\0');
  }
  return false;
}

Assistant:

bool BoundCaseExpression::Equals(const BaseExpression &other_p) const {
	if (!Expression::Equals(other_p)) {
		return false;
	}
	auto &other = other_p.Cast<BoundCaseExpression>();
	if (case_checks.size() != other.case_checks.size()) {
		return false;
	}
	for (idx_t i = 0; i < case_checks.size(); i++) {
		if (!Expression::Equals(*case_checks[i].when_expr, *other.case_checks[i].when_expr)) {
			return false;
		}
		if (!Expression::Equals(*case_checks[i].then_expr, *other.case_checks[i].then_expr)) {
			return false;
		}
	}
	if (!Expression::Equals(*else_expr, *other.else_expr)) {
		return false;
	}
	return true;
}